

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_texshader.cpp
# Opt level: O1

void __thiscall FShaderLayer::Update(FShaderLayer *this,float diff)

{
  float fVar1;
  
  do {
    FCycler::Update(&this->r,diff);
    FCycler::Update(&this->g,diff);
    FCycler::Update(&this->b,diff);
    FCycler::Update(&this->alpha,diff);
    FCycler::Update(&this->vectorY,diff);
    FCycler::Update(&this->vectorX,diff);
    FCycler::Update(&this->scaleX,diff);
    FCycler::Update(&this->scaleY,diff);
    FCycler::Update(&this->adjustX,diff);
    FCycler::Update(&this->adjustY,diff);
    FCycler::Update(&this->srcFactor,diff);
    FCycler::Update(&this->dstFactor,diff);
    fVar1 = (this->vectorX).m_current * diff + this->offsetX;
    fVar1 = (float)(~-(uint)(fVar1 < 1.0) & (uint)(fVar1 + -1.0) |
                   (uint)fVar1 & -(uint)(fVar1 < 1.0));
    this->offsetX =
         (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar1 | (uint)(fVar1 + 1.0) & -(uint)(fVar1 < 0.0));
    fVar1 = (this->vectorY).m_current * diff + this->offsetY;
    fVar1 = (float)(~-(uint)(fVar1 < 1.0) & (uint)(fVar1 + -1.0) |
                   (uint)fVar1 & -(uint)(fVar1 < 1.0));
    this->offsetY =
         (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar1 | (uint)(fVar1 + 1.0) & -(uint)(fVar1 < 0.0));
    fVar1 = this->rotate * diff + this->rotation;
    fVar1 = (float)(~-(uint)(360.0 < fVar1) & (uint)fVar1 |
                   (uint)(fVar1 + -360.0) & -(uint)(360.0 < fVar1));
    this->rotation =
         (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar1 | (uint)(fVar1 + 360.0) & -(uint)(fVar1 < 0.0))
    ;
    this = this->layerMask;
  } while (this != (FShaderLayer *)0x0);
  return;
}

Assistant:

void FShaderLayer::Update(float diff)
{
	r.Update(diff);
	g.Update(diff);
	b.Update(diff);
	alpha.Update(diff);
	vectorY.Update(diff);
	vectorX.Update(diff);
	scaleX.Update(diff);
	scaleY.Update(diff);
	adjustX.Update(diff);
	adjustY.Update(diff);
	srcFactor.Update(diff);
	dstFactor.Update(diff);

	offsetX += vectorX * diff;
	if (offsetX >= 1.f) offsetX -= 1.f;
	if (offsetX < 0.f) offsetX += 1.f;

	offsetY += vectorY * diff;
	if (offsetY >= 1.f) offsetY -= 1.f;
	if (offsetY < 0.f) offsetY += 1.f;

	rotation += rotate * diff;
	if (rotation > 360.f) rotation -= 360.f;
	if (rotation < 0.f) rotation += 360.f;

	if (layerMask != NULL) layerMask->Update(diff);
}